

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
* __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>
::
multiply_source_and_add<std::vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>
           *this,vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>_>_>
                 *column,Field_element *val)

{
  if (*val == true) {
    _add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>,std::vector<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>>>>
              (column,(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                       *)this);
  }
  return (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
          *)this;
}

Assistant:

inline Intrusive_list_column<Master_matrix>& Intrusive_list_column<Master_matrix>::multiply_source_and_add(
    const Entry_range& column,
    const Field_element& val)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, Intrusive_list_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    if (val) {
      _add(column);
    }
  } else {
    _multiply_source_and_add(column, val);
  }

  return *this;
}